

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

int loguru::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  ushort uVar2;
  Text *__s;
  Text TVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  size_t __n;
  ctype *pcVar10;
  undefined8 *in_RDX;
  uint uVar11;
  char *__s_00;
  long lVar12;
  undefined8 *in_RSI;
  EVP_PKEY_CTX *pEVar13;
  uint uVar14;
  void *__ptr;
  char *pcVar15;
  ulong uVar16;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  Text fail_info;
  Text str_right;
  Text user_msg;
  int local_ec;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  pcVar8 = DAT_00159ee0;
  if ((long)*(int *)ctx < 1) {
    textprintf((char *)&str_left,"%d");
    textprintf((char *)&str_right,"%d",0);
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",
               str_left._str,">",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/strandborg[P]AlsavoCtrl/loguru.cpp"
                  ,0x24c,"%s",user_msg._str);
  }
  if (in_RSI[*(int *)ctx] != 0) {
    textprintf((char *)&str_left,"N/A");
    textprintf((char *)&str_right,"N/A");
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
               "nullptr",str_left._str,"==",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/strandborg[P]AlsavoCtrl/loguru.cpp"
                  ,0x24d,"%s",user_msg._str);
  }
  pcVar7 = (char *)*in_RSI;
  pcVar15 = (char *)*in_RSI;
  do {
    do {
      __s_00 = pcVar7;
      pcVar7 = pcVar15 + 1;
      cVar5 = *pcVar15;
      pcVar15 = pcVar7;
    } while (cVar5 == '/');
  } while ((cVar5 == '\\') || (pcVar7 = __s_00, cVar5 != '\0'));
  strlen(__s_00);
  std::__cxx11::string::_M_replace(0x159ed8,0,pcVar8,(ulong)__s_00);
  pcVar8 = getcwd(&s_current_dir,0x1000);
  if (pcVar8 == (char *)0x0) {
    errno_as_text();
    TVar3 = str_left;
    iVar6 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar6 = g_stderr_verbosity;
    }
    if (-2 < iVar6) {
      log(__x);
    }
    free(TVar3._str);
  }
  pcVar8 = (char *)0x0;
  __x_00 = (double)std::__cxx11::string::_M_replace(0x159ef8,0,DAT_00159f00,0x142aa3);
  uVar11 = *(uint *)ctx;
  if (0 < (int)uVar11) {
    lVar12 = 0;
    do {
      pcVar8 = (char *)in_RSI[lVar12];
      __x_00 = (double)std::__cxx11::string::string
                                 ((string *)&str_left,pcVar8,(allocator *)&str_right);
      uVar4 = local_c0.__val[0];
      TVar3 = str_left;
      if (local_c0.__val[0] != 0) {
        uVar16 = 0;
        do {
          bVar1 = TVar3._str[uVar16];
          uVar11 = (uint)bVar1;
          if (0x1f < bVar1) {
            if (bVar1 < 0x27) {
              if (uVar11 == 0x20) {
                pcVar8 = "\\ ";
              }
              else {
                if (uVar11 != 0x22) goto switchD_0012d906_default;
                pcVar8 = "\\\"";
              }
            }
            else if (uVar11 == 0x27) {
              pcVar8 = "\\\'";
            }
            else {
              if (uVar11 != 0x5c) goto switchD_0012d906_default;
              pcVar8 = "\\\\";
            }
            goto switchD_0012d906_caseD_7;
          }
          pcVar8 = "\\a";
          switch(bVar1) {
          case 7:
            break;
          case 8:
            pcVar8 = "\\b";
            break;
          case 9:
            pcVar8 = "\\t";
            break;
          case 10:
            pcVar8 = "\\n";
            break;
          case 0xb:
            pcVar8 = "\\v";
            break;
          case 0xc:
            pcVar8 = "\\f";
            break;
          case 0xd:
            pcVar8 = "\\r";
            break;
          default:
switchD_0012d906_default:
            if (bVar1 < 0x20) {
              pcVar8 = "\\x";
              std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
              write_hex_digit((string *)(ulong)(bVar1 >> 4),(uint)pcVar8);
              write_hex_digit((string *)(ulong)(uVar11 & 0xf),(uint)pcVar8);
              __x_00 = extraout_XMM0_Qa;
            }
            else {
              pcVar8 = (char *)(ulong)(uint)(int)(char)bVar1;
              __x_00 = (double)std::__cxx11::string::push_back(-8);
            }
            goto LAB_0012d986;
          }
switchD_0012d906_caseD_7:
          __x_00 = (double)std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_0012d986:
          uVar16 = uVar16 + 1;
        } while (uVar4 != uVar16);
      }
      if ((ulong *)str_left._str != local_c0.__val + 1) {
        operator_delete(str_left._str);
        __x_00 = extraout_XMM0_Qa_00;
      }
      lVar12 = lVar12 + 1;
      uVar11 = *(uint *)ctx;
      lVar9 = (long)(int)uVar11;
      if (lVar12 < lVar9) {
        pcVar8 = " ";
        __x_00 = (double)std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
        uVar11 = *(uint *)ctx;
        lVar9 = (long)(int)uVar11;
      }
    } while (lVar12 < lVar9);
  }
  __ptr = (void *)(ulong)uVar11;
  __s = (Text *)*in_RDX;
  if (__s != (Text *)0x0) {
    if (1 < (int)uVar11) {
      local_ec = 1;
      uVar11 = 1;
      do {
        pcVar15 = (char *)in_RSI[(int)uVar11];
        __n = strlen((char *)__s);
        pcVar8 = (char *)__s;
        iVar6 = strncmp(pcVar15,(char *)__s,__n);
        __x_00 = extraout_XMM0_Qa_01;
        if (iVar6 == 0) {
          bVar1 = pcVar15[__n];
          pcVar8 = "";
          std::locale::locale((locale *)&str_left,"");
          pcVar10 = std::use_facet<std::ctype<char>>((locale *)&str_left);
          uVar2 = *(ushort *)(*(long *)(pcVar10 + 0x30) + (ulong)bVar1 * 2);
          __x_00 = (double)std::locale::~locale((locale *)&str_left);
          if ((uVar2 >> 10 & 1) != 0) {
            pcVar15 = (char *)in_RSI[(int)uVar11];
            goto LAB_0012daec;
          }
          pcVar15 = pcVar15 + __n;
          cVar5 = *pcVar15;
          if (cVar5 == '\0') {
            uVar11 = uVar11 + 1;
            pEVar13 = (EVP_PKEY_CTX *)(ulong)*(uint *)ctx;
            if ((int)*(uint *)ctx <= (int)uVar11) goto LAB_0012dfc8;
            pcVar15 = (char *)in_RSI[(int)uVar11];
            uVar14 = (int)__ptr - 2;
            cVar5 = *pcVar15;
          }
          else {
            uVar14 = (int)__ptr - 1;
          }
          __ptr = (void *)(ulong)uVar14;
          pEVar13 = (EVP_PKEY_CTX *)(pcVar15 + (cVar5 == '='));
          iVar6 = get_verbosity_from_name((char *)pEVar13);
          __x_00 = extraout_XMM0_Qa_02;
          if (iVar6 == -10) {
            str_left._str = (char *)0x0;
            pcVar8 = (char *)&str_left;
            lVar12 = strtol((char *)pEVar13,(char **)pcVar8,10);
            g_stderr_verbosity = (int)lVar12;
            if ((str_left._str == (char *)0x0) ||
               (__x_00 = extraout_XMM0_Qa_03, iVar6 = g_stderr_verbosity, *str_left._str != '\0')) {
              init(pEVar13);
LAB_0012dfc8:
              textprintf((char *)&str_left,"%d",(ulong)uVar11);
              textprintf((char *)&str_right,"%d",(ulong)pEVar13 & 0xffffffff);
              textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<",
                         "argc",str_left._str,"<",str_right._str);
              textprintf((char *)&user_msg,"Missing verbosiy level after %s",__s);
              log_and_abort(0,fail_info._str,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/strandborg[P]AlsavoCtrl/loguru.cpp"
                            ,0x1e2,"%s",user_msg._str);
            }
          }
        }
        else {
LAB_0012daec:
          lVar12 = (long)local_ec;
          local_ec = local_ec + 1;
          in_RSI[lVar12] = pcVar15;
          iVar6 = g_stderr_verbosity;
        }
        g_stderr_verbosity = iVar6;
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < *(int *)ctx);
    }
    *(int *)ctx = (int)__ptr;
    in_RSI[(int)__ptr] = 0;
  }
  if ((char *)in_RDX[1] != (char *)0x0) {
    set_thread_name((char *)in_RDX[1]);
    __x_00 = extraout_XMM0_Qa_04;
  }
  if (-1 < g_stderr_verbosity) {
    if (g_preamble_header == '\x01') {
      print_preamble_header((char *)&str_left,(size_t)pcVar8);
      if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
        fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
      }
      else {
        fprintf(_stderr,"%s\n",&str_left);
      }
    }
    fflush(_stderr);
    __x_00 = extraout_XMM0_Qa_05;
  }
  iVar6 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar6 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar6) {
    __x_00 = log(__x_00);
  }
  iVar6 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar6 = g_stderr_verbosity;
  }
  if ((s_current_dir != '\0') && (g_internal_verbosity <= iVar6)) {
    __x_00 = log(__x_00);
  }
  iVar6 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar6 = g_stderr_verbosity;
  }
  if ((g_internal_verbosity <= iVar6) &&
     (__x_00 = log(__x_00), iVar6 = s_max_out_verbosity, s_max_out_verbosity < g_stderr_verbosity))
  {
    iVar6 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar6) {
    log(__x_00);
  }
  _s_signal_options = in_RDX[2];
  memset(&str_left,0,0x98);
  sigemptyset(&local_c0);
  local_40 = local_40 | 4;
  str_left._str = (char *)signal_handler;
  if (*(char *)((long)in_RDX + 0x11) != '\x01') {
LAB_0012dd2c:
    if (*(char *)((long)in_RDX + 0x12) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0x7;
      iVar6 = sigaction(7,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e075;
    }
    if (*(char *)((long)in_RDX + 0x13) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0x8;
      iVar6 = sigaction(8,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e07a;
    }
    if (*(char *)((long)in_RDX + 0x14) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0x4;
      iVar6 = sigaction(4,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e07f;
    }
    if (*(char *)((long)in_RDX + 0x15) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0x2;
      iVar6 = sigaction(2,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e084;
    }
    if (*(char *)((long)in_RDX + 0x16) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0xb;
      iVar6 = sigaction(0xb,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e089;
    }
    if (*(char *)((long)in_RDX + 0x17) == '\x01') {
      pEVar13 = (EVP_PKEY_CTX *)0xf;
      iVar6 = sigaction(0xf,(sigaction *)&str_left,(sigaction *)0x0);
      if (iVar6 == -1) goto LAB_0012e08e;
    }
    iVar6 = atexit(on_atexit);
    return iVar6;
  }
  pEVar13 = (EVP_PKEY_CTX *)0x6;
  iVar6 = sigaction(6,(sigaction *)&str_left,(sigaction *)0x0);
  if (iVar6 != -1) goto LAB_0012dd2c;
  init(pEVar13);
LAB_0012e075:
  init(pEVar13);
LAB_0012e07a:
  init(pEVar13);
LAB_0012e07f:
  init(pEVar13);
LAB_0012e084:
  init(pEVar13);
LAB_0012e089:
  init(pEVar13);
LAB_0012e08e:
  iVar6 = init(pEVar13);
  free(__ptr);
  _Unwind_Resume(iVar6);
}

Assistant:

void init(int& argc, char* argv[], const Options& options)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir))) {
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: " LOGURU_FMT(s) "", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (options.verbosity_flag) {
			parse_args(argc, argv, options.verbosity_flag);
		}

		if (const auto main_thread_name = options.main_thread_name) {
			#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
				set_thread_name(main_thread_name);
			#elif LOGURU_PTHREADS
				char old_thread_name[16] = {0};
				auto this_thread = pthread_self();
				#if defined(__APPLE__) || defined(__linux__) || defined(__sun)
					pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
				#endif
				if (old_thread_name[0] == 0) {
					#ifdef __APPLE__
						pthread_setname_np(main_thread_name);
					#elif defined(__FreeBSD__) || defined(__OpenBSD__)
						pthread_set_name_np(this_thread, main_thread_name);
					#elif defined(__linux__) || defined(__sun)
						pthread_setname_np(this_thread, main_thread_name);
					#endif
				}
			#endif // LOGURU_PTHREADS
		}

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble_header) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: " LOGURU_FMT(s) "", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: " LOGURU_FMT(s) "", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: " LOGURU_FMT(d) "", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers(options.signals);

		atexit(on_atexit);
	}